

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
diligent_spirv_cross::CompilerGLSL::convert_double_to_string_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRConstant *c,uint32_t col,
          uint32_t row)

{
  uint64_t uVar1;
  bool bVar2;
  CompilerError *pCVar3;
  char *pcVar4;
  char (*in_stack_fffffffffffffc90) [5];
  char *comment;
  double local_360;
  diligent_spirv_cross local_358 [32];
  char print_buffer [64];
  string local_2f0;
  undefined1 local_2d0 [32];
  uint *local_2b0;
  size_t local_2a8;
  size_t local_2a0;
  uint local_298 [8];
  bool *local_278;
  size_t local_270;
  size_t local_268;
  bool local_260 [8];
  uint32_t local_258;
  bool local_254;
  bool local_253;
  StorageClass local_250;
  TypedID<(diligent_spirv_cross::Types)1> *local_248;
  size_t local_240;
  size_t local_238;
  TypedID<(diligent_spirv_cross::Types)1> local_230 [8];
  uint *local_210;
  size_t local_208;
  size_t local_200;
  uint local_1f8 [8];
  undefined1 local_1d8 [28];
  TypeID local_1bc;
  __node_base_ptr *local_1b8;
  size_type local_1b0;
  __node_base local_1a8;
  size_type sStack_1a0;
  float local_198;
  size_t local_190;
  __node_base_ptr p_Stack_188;
  undefined1 local_180 [192];
  uint *local_c0;
  size_t local_b8;
  size_t local_b0;
  uint auStack_a8 [8];
  undefined1 local_88 [28];
  TypeID local_6c;
  __node_base_ptr *local_68;
  size_type local_60;
  __node_base local_58;
  size_type sStack_50;
  float local_48;
  size_t local_40;
  __node_base_ptr p_Stack_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_360 = (c->m).c[col].r[row].f64;
  if ((NAN(local_360) || NAN(local_360)) || ABS(local_360) == INFINITY) {
    bVar2 = is_legacy(this);
    if (bVar2) {
      if ((this->options).es == true) {
        pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar3,"FP64 not supported in ES profile.");
      }
      else {
        if ((this->options).version < 400) {
          ::std::__cxx11::string::string
                    ((string *)local_2d0,"GL_ARB_gpu_shader_fp64",(allocator *)local_180);
          require_extension_internal(this,(string *)local_2d0);
          ::std::__cxx11::string::~string((string *)local_2d0);
        }
        if (((INFINITY <= local_360) || (local_360 <= -INFINITY)) || (NAN(local_360))) {
          ::std::__cxx11::string::assign((char *)__return_storage_ptr__);
          return __return_storage_ptr__;
        }
        pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar3,"Cannot represent non-finite floating point constant.");
      }
      __cxa_throw(pCVar3,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_2b0 = local_298;
    local_2d0._8_4_ = 0;
    local_2d0._0_8_ = &PTR__SPIRType_00ac2d18;
    local_2d0._12_4_ = 0x16;
    local_2d0._28_4_ = 1;
    local_2a8 = 0;
    local_2a0 = 8;
    local_278 = local_260;
    local_270 = 0;
    local_268 = 8;
    local_258 = 0;
    local_254 = false;
    local_253 = false;
    local_250 = Generic;
    local_248 = local_230;
    local_240 = 0;
    local_180._32_8_ = local_180 + 0x38;
    local_180._8_8_ = 0x1500000000;
    local_238 = 8;
    local_208 = 0;
    local_180._0_8_ = &PTR__SPIRType_00ac2d18;
    local_180._40_8_ = 0;
    local_210 = local_1f8;
    local_180._48_8_ = 8;
    local_180._88_8_ = local_180 + 0x70;
    local_180._96_8_ = 0;
    local_200 = 8;
    local_180._104_8_ = 8;
    local_180._120_4_ = 0;
    local_180[0x7c] = false;
    local_180[0x7d] = false;
    local_180._136_8_ = local_180 + 0xa0;
    local_180._144_8_ = 0;
    local_180._152_8_ = 8;
    local_b8 = 0;
    local_c0 = auStack_a8;
    local_b0 = 8;
    local_1b8 = &p_Stack_188;
    local_1d8._0_7_ = 0;
    local_1d8._7_4_ = 0;
    local_1d8._12_4_ = 0;
    local_1d8._16_4_ = ImageFormatUnknown;
    local_1d8._20_4_ = AccessQualifierReadOnly;
    local_1d8._24_4_ = 0;
    local_1bc.id = 0;
    local_68 = &p_Stack_38;
    local_88._0_7_ = 0;
    local_88._7_4_ = 0;
    local_88._12_4_ = 0;
    local_88._16_4_ = ImageFormatUnknown;
    local_88._20_4_ = AccessQualifierReadOnly;
    local_88._24_4_ = 0;
    local_6c.id = 0;
    local_1b0 = 1;
    local_1a8._M_nxt = (_Hash_node_base *)0x0;
    sStack_1a0 = 0;
    local_60 = 1;
    local_198 = 1.0;
    local_190 = 0;
    p_Stack_188 = (__node_base_ptr)0x0;
    local_58._M_nxt = (_Hash_node_base *)0x0;
    sStack_50 = 0;
    local_48 = 1.0;
    local_2d0._16_4_ = 0xe;
    local_2d0._20_8_ = 0x100000040;
    local_40 = 0;
    p_Stack_38 = (__node_base_ptr)0x0;
    local_180._16_4_ = UInt64;
    local_180._20_4_ = 0x40;
    local_180._24_4_ = 1;
    uVar1 = (c->m).c[col].r[row].u64;
    local_180._28_4_ = local_2d0._28_4_;
    local_180._128_4_ = local_250;
    if (((this->options).es == true) && ((this->options).version < 0x136)) {
      pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (pCVar3,"64-bit integers not supported in ES profile before version 310.");
      __cxa_throw(pCVar3,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    ::std::__cxx11::string::string
              ((string *)print_buffer,"GL_ARB_gpu_shader_int64",(allocator *)&local_2f0);
    require_extension_internal(this,(string *)print_buffer);
    ::std::__cxx11::string::~string((string *)print_buffer);
    pcVar4 = "ul";
    if ((this->backend).long_long_literal_suffix != false) {
      pcVar4 = "ull";
    }
    snprintf(print_buffer,0x40,"0x%llx%s",uVar1,pcVar4);
    comment = "inf";
    if (-INFINITY < local_360) {
      if (NAN(local_360)) {
        comment = "nan";
      }
    }
    else {
      comment = "-inf";
    }
    (*(this->super_Compiler)._vptr_Compiler[0x3c])(local_358,this,local_2d0,local_180);
    join<std::__cxx11::string,char_const(&)[2],char(&)[64],char_const(&)[5],char_const*&,char_const(&)[5]>
              (&local_2f0,local_358,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6fe2e7,
               (char (*) [2])print_buffer,(char (*) [64])" /* ",(char (*) [5])&comment,
               (char **)" */)",in_stack_fffffffffffffc90);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_2f0);
    ::std::__cxx11::string::~string((string *)&local_2f0);
    ::std::__cxx11::string::~string((string *)local_358);
    SPIRType::~SPIRType((SPIRType *)local_180);
    SPIRType::~SPIRType((SPIRType *)local_2d0);
  }
  else {
    format_double_abi_cxx11_((string *)local_2d0,this,local_360);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_2d0);
    ::std::__cxx11::string::~string((string *)local_2d0);
    if ((this->backend).double_literal_suffix == true) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CompilerGLSL::convert_double_to_string(const SPIRConstant &c, uint32_t col, uint32_t row)
{
	string res;
	double double_value = c.scalar_f64(col, row);

	if (std::isnan(double_value) || std::isinf(double_value))
	{
		// Use special representation.
		if (!is_legacy())
		{
			SPIRType out_type { OpTypeFloat };
			SPIRType in_type { OpTypeInt };
			out_type.basetype = SPIRType::Double;
			in_type.basetype = SPIRType::UInt64;
			out_type.vecsize = 1;
			in_type.vecsize = 1;
			out_type.width = 64;
			in_type.width = 64;

			uint64_t u64_value = c.scalar_u64(col, row);

			if (options.es && options.version < 310) // GL_NV_gpu_shader5 fallback requires 310.
				SPIRV_CROSS_THROW("64-bit integers not supported in ES profile before version 310.");
			require_extension_internal("GL_ARB_gpu_shader_int64");

			char print_buffer[64];
#ifdef _WIN32
			sprintf(print_buffer, "0x%llx%s", static_cast<unsigned long long>(u64_value),
			        backend.long_long_literal_suffix ? "ull" : "ul");
#else
			snprintf(print_buffer, sizeof(print_buffer), "0x%llx%s", static_cast<unsigned long long>(u64_value),
			         backend.long_long_literal_suffix ? "ull" : "ul");
#endif

			const char *comment = "inf";
			if (double_value == -numeric_limits<double>::infinity())
				comment = "-inf";
			else if (std::isnan(double_value))
				comment = "nan";
			res = join(bitcast_glsl_op(out_type, in_type), "(", print_buffer, " /* ", comment, " */)");
		}
		else
		{
			if (options.es)
				SPIRV_CROSS_THROW("FP64 not supported in ES profile.");
			if (options.version < 400)
				require_extension_internal("GL_ARB_gpu_shader_fp64");

			if (double_value == numeric_limits<double>::infinity())
			{
				if (backend.double_literal_suffix)
					res = "(1.0lf / 0.0lf)";
				else
					res = "(1.0 / 0.0)";
			}
			else if (double_value == -numeric_limits<double>::infinity())
			{
				if (backend.double_literal_suffix)
					res = "(-1.0lf / 0.0lf)";
				else
					res = "(-1.0 / 0.0)";
			}
			else if (std::isnan(double_value))
			{
				if (backend.double_literal_suffix)
					res = "(0.0lf / 0.0lf)";
				else
					res = "(0.0 / 0.0)";
			}
			else
				SPIRV_CROSS_THROW("Cannot represent non-finite floating point constant.");
		}
	}
	else
	{
		res = format_double(double_value);
		if (backend.double_literal_suffix)
			res += "lf";
	}

	return res;
}